

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  thread logicThread;
  App app;
  MySimulator sim;
  thread tStack_1b8;
  App *local_1b0;
  code *local_1a8;
  undefined8 local_1a0;
  App local_198;
  MySimulator local_128;
  
  brown::MySimulator::MySimulator(&local_128);
  brown::App::App(&local_198,&local_128.super_Simulator);
  local_1a8 = brown::App::runLogic;
  local_1a0 = 0;
  local_1b0 = &local_198;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&tStack_1b8,(type *)&local_1a8,&local_1b0);
  iVar1 = brown::App::runGraphics(&local_198);
  std::thread::join();
  std::thread::~thread(&tStack_1b8);
  brown::App::~App(&local_198);
  brown::Simulator::~Simulator(&local_128.super_Simulator);
  return iVar1;
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::MySimulator sim;
    brown::App app(sim);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}